

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O2

int ffcpdt(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  LONGLONG outdatastart;
  LONGLONG indatastart;
  LONGLONG indataend;
  char buffer [2880];
  
  if (0 < *status) {
    return *status;
  }
  if (infptr == outfptr) {
    *status = 0x65;
    iVar1 = 0x65;
  }
  else {
    ffghadll(infptr,(LONGLONG *)0x0,&indatastart,&indataend,status);
    ffghadll(outfptr,(LONGLONG *)0x0,&outdatastart,(LONGLONG *)0x0,status);
    lVar2 = (indataend - indatastart) / 0xb40;
    if (0xb3f < indataend - indatastart) {
      if (infptr->Fptr == outfptr->Fptr) {
        while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
          ffmbyt(infptr,indatastart,0,status);
          ffgbyt(infptr,0xb40,buffer,status);
          ffmbyt(outfptr,outdatastart,1,status);
          ffpbyt(outfptr,0xb40,buffer,status);
          indatastart = indatastart + 0xb40;
          outdatastart = outdatastart + 0xb40;
        }
      }
      else {
        ffmbyt(infptr,indatastart,0,status);
        ffmbyt(outfptr,outdatastart,1,status);
        while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
          ffgbyt(infptr,0xb40,buffer,status);
          ffpbyt(outfptr,0xb40,buffer,status);
        }
      }
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffcpdt(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int *status)         /* IO - error status     */
{
/*
  copy the data unit from the CHDU of infptr to the CHDU of outfptr. 
  This will overwrite any data already in the outfptr CHDU.
*/
    long nb, ii;
    LONGLONG indatastart, indataend, outdatastart;
    char buffer[2880];

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    ffghadll(infptr,  NULL, &indatastart, &indataend, status);
    ffghadll(outfptr, NULL, &outdatastart, NULL, status);

    /* Calculate the number of blocks to be copied  */
    nb = (long) ((indataend - indatastart) / 2880);

    if (nb > 0)
    {
      if (infptr->Fptr == outfptr->Fptr)
      {
        /* copying between 2 HDUs in the SAME file */
        for (ii = 0; ii < nb; ii++)
        {
            ffmbyt(infptr,  indatastart,  REPORT_EOF, status);
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */

            ffmbyt(outfptr, outdatastart, IGNORE_EOF, status);
            ffpbyt(outfptr, 2880L, buffer, status); /* write output block */

            indatastart  += 2880; /* move address */
            outdatastart += 2880; /* move address */
        }
      }
      else
      {
        /* copying between HDUs in separate files */
        /* move to the initial copy position in each of the files */
        ffmbyt(infptr,  indatastart,  REPORT_EOF, status);
        ffmbyt(outfptr, outdatastart, IGNORE_EOF, status);

        for (ii = 0; ii < nb; ii++)
        {
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */
            ffpbyt(outfptr, 2880L, buffer, status); /* write output block */
        }
      }
    }
    return(*status);
}